

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjoint_sets.cpp
# Opt level: O3

void __thiscall
geometrycentral::MarkedDisjointSets::merge(MarkedDisjointSets *this,size_t x,size_t y)

{
  pointer puVar1;
  _Bit_type *p_Var2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  size_t sVar7;
  
  sVar3 = find(this,x);
  sVar4 = find(this,y);
  puVar1 = (this->rank).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar7 = sVar4;
  sVar5 = sVar3;
  if (puVar1[sVar4] < puVar1[sVar3]) {
    sVar7 = sVar3;
    sVar5 = sVar4;
  }
  (this->parent).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[sVar5] = sVar7;
  if (puVar1[sVar3] == puVar1[sVar4]) {
    puVar1[sVar4] = puVar1[sVar3] + 1;
  }
  p_Var2 = (this->marked).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  sVar5 = sVar3 + 0x3f;
  if (-1 < (long)sVar3) {
    sVar5 = sVar3;
  }
  uVar6 = (ulong)((sVar3 & 0x800000000000003f) < 0x8000000000000001);
  sVar7 = sVar4 + 0x3f;
  if (-1 < (long)sVar4) {
    sVar7 = sVar4;
  }
  if (((p_Var2[((long)sVar5 >> 6) + uVar6 + 0xffffffffffffffff] >> (sVar3 & 0x3f) & 1) != 0) ||
     ((p_Var2[((long)sVar7 >> 6) +
              (ulong)((sVar4 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
       (sVar4 & 0x3f) & 1) != 0)) {
    p_Var2[((long)sVar5 >> 6) + uVar6 + 0xffffffffffffffff] =
         p_Var2[((long)sVar5 >> 6) + uVar6 + 0xffffffffffffffff] | 1L << (sVar3 & 0x3f);
    p_Var2[((long)sVar7 >> 6) +
           (ulong)((sVar4 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] =
         p_Var2[((long)sVar7 >> 6) +
                (ulong)((sVar4 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] |
         1L << (sVar4 & 0x3f);
  }
  return;
}

Assistant:

void MarkedDisjointSets::merge(size_t x, size_t y) {
  x = find(x);
  y = find(y);

  // Smaller tree becomes a subtree of the larger tree
  if (rank[x] > rank[y])
    parent[y] = x;
  else
    parent[x] = y;

  if (rank[x] == rank[y]) rank[y]++;

  // If either was marked, both are marked
  if (marked[x] || marked[y]) {
    marked[x] = true;
    marked[y] = true;
  }
}